

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int mbedtls_asn1_get_alg(uchar **p,uchar *end,mbedtls_asn1_buf *alg,mbedtls_asn1_buf *params)

{
  uchar *end_00;
  uchar **in_RCX;
  uint *in_RDX;
  long in_RSI;
  uchar **in_RDI;
  size_t len;
  int ret;
  size_t *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  local_4 = mbedtls_asn1_get_tag
                      (in_RCX,(uchar *)CONCAT44(0xffffff92,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,0);
  if (local_4 == 0) {
    if (in_RSI - (long)*in_RDI < 1) {
      local_4 = -0x60;
    }
    else {
      *in_RDX = (uint)**in_RDI;
      end_00 = *in_RDI + (long)in_stack_ffffffffffffffc8;
      local_4 = mbedtls_asn1_get_tag
                          (in_RCX,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffc8,0);
      if (local_4 == 0) {
        *(uchar **)(in_RDX + 4) = *in_RDI;
        *in_RDI = *in_RDI + *(long *)(in_RDX + 2);
        if (*in_RDI == end_00) {
          mbedtls_platform_zeroize
                    ((void *)(ulong)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
          local_4 = 0;
        }
        else {
          *(uint *)in_RCX = (uint)**in_RDI;
          *in_RDI = *in_RDI + 1;
          local_4 = mbedtls_asn1_get_len(in_RDI,end_00,(size_t *)(in_RCX + 1));
          if (local_4 == 0) {
            in_RCX[2] = *in_RDI;
            *in_RDI = in_RCX[1] + (long)*in_RDI;
            if (*in_RDI == end_00) {
              local_4 = 0;
            }
            else {
              local_4 = -0x66;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_get_alg(unsigned char **p,
                         const unsigned char *end,
                         mbedtls_asn1_buf *alg, mbedtls_asn1_buf *params)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    alg->tag = **p;
    end = *p + len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &alg->len, MBEDTLS_ASN1_OID)) != 0) {
        return ret;
    }

    alg->p = *p;
    *p += alg->len;

    if (*p == end) {
        mbedtls_platform_zeroize(params, sizeof(mbedtls_asn1_buf));
        return 0;
    }

    params->tag = **p;
    (*p)++;

    if ((ret = mbedtls_asn1_get_len(p, end, &params->len)) != 0) {
        return ret;
    }

    params->p = *p;
    *p += params->len;

    if (*p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}